

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_json.cc
# Opt level: O0

void __thiscall anon_unknown.dwarf_311d66::Handlers::pushKey(Handlers *this,string *key)

{
  JSONHandler *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> key_00;
  element_type *peVar1;
  shared_ptr<JSONHandler> local_38;
  undefined1 local_28 [8];
  shared_ptr<JSONHandler> new_jh;
  string *key_local;
  Handlers *this_local;
  
  new_jh.super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)key;
  std::make_shared<JSONHandler>();
  key_00._M_pi = new_jh.super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi;
  this_00 = this->jh;
  std::shared_ptr<JSONHandler>::shared_ptr(&local_38,(shared_ptr<JSONHandler> *)local_28);
  JSONHandler::addDictKeyHandler(this_00,(string *)key_00._M_pi,&local_38);
  std::shared_ptr<JSONHandler>::~shared_ptr(&local_38);
  peVar1 = std::__shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>::get
                     ((__shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2> *)local_28);
  this->jh = peVar1;
  std::vector<std::shared_ptr<JSONHandler>,std::allocator<std::shared_ptr<JSONHandler>>>::
  emplace_back<std::shared_ptr<JSONHandler>>
            ((vector<std::shared_ptr<JSONHandler>,std::allocator<std::shared_ptr<JSONHandler>>> *)
             this,(shared_ptr<JSONHandler> *)local_28);
  std::shared_ptr<JSONHandler>::~shared_ptr((shared_ptr<JSONHandler> *)local_28);
  return;
}

Assistant:

void
Handlers::pushKey(std::string const& key)
{
    auto new_jh = std::make_shared<JSONHandler>();
    this->jh->addDictKeyHandler(key, new_jh);
    this->jh = new_jh.get();
    this->json_handlers.emplace_back(std::move(new_jh));
}